

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O3

Aig_Man_t * Ssw_LatchCorrespondence(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  Aig_Man_t *pAVar1;
  Ssw_Pars_t SStack_b8;
  
  if (pPars == (Ssw_Pars_t *)0x0) {
    memset(&SStack_b8,0,0xa8);
    SStack_b8.nFramesK = 1;
    SStack_b8.nFramesAddSim = 2;
    SStack_b8.nResimDelta = 1000;
    SStack_b8.nStepsMax = -1;
    SStack_b8.fPolarFlip = 0;
    SStack_b8.fLatchCorr = 0;
    SStack_b8.fConstCorr = 0;
    SStack_b8.fOutputCorr = 0;
    SStack_b8.fSemiFormal = 0;
    SStack_b8.fDynamic = 0;
    SStack_b8.fLocalSim = 0;
    SStack_b8.nRecycleCalls2 = 0xfa;
    SStack_b8.fLatchCorrOpt = 1;
    SStack_b8.nSatVarMax = 1000;
    SStack_b8.nRecycleCalls = 0x32;
    SStack_b8.nSatVarMax2 = 5000;
    SStack_b8.nBTLimit = 10000;
    SStack_b8.nBTLimitGlobal = 5000000;
    SStack_b8.nMinDomSize = 100;
    SStack_b8.nItersStop = -1;
    pPars = &SStack_b8;
  }
  pAVar1 = Ssw_SignalCorrespondence(pAig,pPars);
  return pAVar1;
}

Assistant:

Aig_Man_t * Ssw_LatchCorrespondence( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pRes;
    Ssw_Pars_t Pars;
    if ( pPars == NULL )
        Ssw_ManSetDefaultParamsLcorr( pPars = &Pars );
    pRes = Ssw_SignalCorrespondence( pAig, pPars );
//    if ( pPars->fConstrs && pPars->fVerbose )
//        Ssw_ReportConeReductions( pAig, pRes );
    return pRes;
}